

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getline.c
# Opt level: O2

void hooked_curses_getlin(char *query,char *buf,getlin_hook_proc hook,void *hook_proc_arg)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  undefined4 uVar4;
  wchar_t wVar5;
  gamewin *gw;
  WINDOW *pWVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  wchar_t output_count;
  char **output;
  
  uVar4 = curs_set(1);
  ui_wrap_text(L'L',query,&output_count,&output);
  ui_free_wrap(output);
  gw = alloc_gamewin(L'\x18');
  pWVar6 = newdialog(output_count + L'\x03',L'P');
  gw->win = pWVar6;
  gw->draw = draw_getline;
  gw->resize = resize_getline;
  gw[1].draw = (_func_void_gamewin_ptr *)buf;
  gw[1].resize = (_func_void_gamewin_ptr *)query;
  *buf = '\0';
  bVar2 = true;
  cVar3 = '\0';
  uVar9 = 0;
LAB_001097fa:
  do {
    uVar10 = uVar9;
    if (!bVar2) {
      curs_set(uVar4);
      delwin(gw->win);
      delete_gamewin(gw);
      redraw_game_windows();
      return;
    }
LAB_00109805:
    do {
      draw_getline(gw);
      wVar5 = nh_wgetch(gw->win);
      uVar9 = uVar10;
      switch(wVar5) {
      case L'Ą':
        bVar2 = true;
        if (0 < *(int *)&gw[1].win) {
          *(int *)&gw[1].win = *(int *)&gw[1].win + -1;
          bVar2 = true;
        }
        goto LAB_001097fa;
      case L'ą':
        bVar2 = true;
        if ((ulong)(long)*(int *)&gw[1].win < uVar10) {
          *(int *)&gw[1].win = *(int *)&gw[1].win + 1;
          bVar2 = true;
        }
        goto LAB_001097fa;
      case L'Ć':
        *(undefined4 *)&gw[1].win = 0;
        bVar2 = true;
        goto LAB_001097fa;
      case L'ć':
switchD_0010987d_caseD_107:
        if (*(int *)&gw[1].win != 0) {
          *(int *)&gw[1].win = *(int *)&gw[1].win + -1;
LAB_00109893:
          bVar2 = true;
          uVar9 = 0;
          if (uVar10 != 0) {
            iVar1 = *(int *)&gw[1].win;
            sVar7 = strlen(buf);
            for (lVar11 = (long)iVar1; lVar11 <= (int)sVar7; lVar11 = lVar11 + 1) {
              buf[lVar11] = buf[lVar11 + 1];
            }
            bVar2 = true;
            uVar9 = uVar10 - 1;
          }
          goto LAB_001097fa;
        }
        goto LAB_00109805;
      }
      if (wVar5 == L'\x7f') goto switchD_0010987d_caseD_107;
      if (wVar5 == L'\r') goto LAB_00109923;
      if (wVar5 == L'Ũ') {
        *(int *)&gw[1].win = (int)uVar10;
        bVar2 = true;
        goto LAB_001097fa;
      }
      if (wVar5 == L'Ŋ') goto LAB_00109893;
      if (wVar5 == L'ŗ') {
LAB_00109923:
        bVar2 = false;
        goto LAB_001097fa;
      }
      if (wVar5 == L'\x1b') {
        buf[0] = '\x1b';
        buf[1] = '\0';
        goto LAB_00109923;
      }
    } while (((uint)(wVar5 + L'\xffffff81') < 0xffffffa1) ||
            (lVar11 = (long)*(int *)&gw[1].win, 0xfd < lVar11));
    sVar7 = strlen(buf);
    for (lVar8 = (long)(int)sVar7; lVar11 <= lVar8; lVar8 = lVar8 + -1) {
      buf[lVar8 + 1] = buf[lVar8];
    }
    buf[lVar11] = (char)wVar5;
    lVar11 = (long)*(int *)&gw[1].win + 1;
    *(int *)&gw[1].win = (int)lVar11;
    if (hook == (getlin_hook_proc)0x0) {
      cVar3 = '\0';
      bVar2 = true;
      uVar9 = uVar10 + 1;
    }
    else {
      if (cVar3 != '\0') {
        buf[lVar11] = '\0';
      }
      cVar3 = (*hook)(buf,hook_proc_arg);
      uVar9 = strlen(buf);
      bVar2 = true;
    }
  } while( true );
}

Assistant:

static void hooked_curses_getlin(const char *query, char *buf,
		       getlin_hook_proc hook, void *hook_proc_arg)
{
    struct gamewin *gw;
    struct win_getline *gldat;
    int height, width, key, prev_curs;
    size_t len = 0;
    nh_bool done = FALSE;
    nh_bool autocomplete = FALSE;
    char **output;
    int output_count;

    prev_curs = curs_set(1);

    /* wrap text just for determining dimensions */
    ui_wrap_text(COLNO - 4, query, &output_count, &output);
    ui_free_wrap(output);
    height = output_count + 3;
    width = COLNO;

    gw = alloc_gamewin(sizeof(struct win_getline));
    gw->win = newdialog(height, width);
    gw->draw = draw_getline;
    gw->resize = resize_getline;
    gldat = (struct win_getline *)gw->extra;
    gldat->buf = buf;
    gldat->query = query;
    
    buf[0] = 0;
    while (!done) {
	draw_getline(gw);
	key = nh_wgetch(gw->win);
	
	switch (key) {
	    case KEY_ESC:
		buf[0] = (char)key;
		buf[1] = 0;
		done = TRUE;
		break;
		
	    case KEY_ENTER:
	    case '\r':
		done = TRUE;
		break;

	    case KEY_BACKSPACE: /* different terminals send different codes... */
	    case KEY_BACKDEL:
		if (gldat->pos == 0) continue;
		gldat->pos--;
		/* fall through */
	    case KEY_DC:
		if (len == 0) continue;
		len--;
		buf_delete(buf, gldat->pos);
		break;
		
	    case KEY_LEFT:
		if (gldat->pos > 0) gldat->pos--;
		break;
		
	    case KEY_RIGHT:
		if (gldat->pos < len) gldat->pos++;
		break;
		
	    case KEY_HOME:
		gldat->pos = 0;
		break;
		
	    case KEY_END:
		gldat->pos = len;
		break;
		
	    default:
		if (' ' > (unsigned) key || (unsigned)key >= 128 || 
		    key == KEY_BACKDEL || gldat->pos >= BUFSZ-2)
		    continue;
		buf_insert(buf, gldat->pos, key);
		gldat->pos++;
		len++;
		
		if (hook) {
		    if (autocomplete)
			/* discard previous completion before looking for a new one */
			buf[gldat->pos] = '\0';
		    
		    autocomplete = (*hook)(buf, hook_proc_arg);
		    len = strlen(buf); /* (*hook) may modify buf */
		} else
		    autocomplete = FALSE;
		
		break;
	}
    }
    
    curs_set(prev_curs);
    
    delwin(gw->win);
    delete_gamewin(gw);
    redraw_game_windows();
}